

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_math_lang.cpp
# Opt level: O2

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* Omega_h::math_lang::get_variables_used
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *expr)

{
  SymbolSetReader reader;
  allocator local_241;
  string local_240;
  storage_union local_220;
  long local_210;
  SymbolSetReader local_208;
  
  SymbolSetReader::SymbolSetReader(&local_208);
  std::__cxx11::string::string((string *)&local_240,"get_variables_used",&local_241);
  Reader::read_string((any *)&local_220,&local_208.super_Reader,expr,&local_240);
  if (local_210 != 0) {
    (**(code **)(local_210 + 8))(&local_220);
    local_210 = 0;
  }
  std::__cxx11::string::~string((string *)&local_240);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&__return_storage_ptr__->_M_t,&local_208.variable_names._M_t);
  SymbolSetReader::~SymbolSetReader(&local_208);
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> get_variables_used(std::string const& expr) {
  SymbolSetReader reader;
  reader.read_string(expr, "get_variables_used");
  return reader.variable_names;
}